

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenastring.h
# Opt level: O0

void __thiscall
google::protobuf::internal::ArenaStringPtr::SetNoArena
          (ArenaStringPtr *this,string *default_value,string *value)

{
  bool bVar1;
  string *this_00;
  string *value_local;
  string *default_value_local;
  ArenaStringPtr *this_local;
  
  bVar1 = IsDefault(this,default_value);
  if (bVar1) {
    this_00 = (string *)operator_new(0x20);
    std::__cxx11::string::string((string *)this_00,(string *)value);
    this->ptr_ = this_00;
  }
  else {
    std::__cxx11::string::operator=((string *)this->ptr_,(string *)value);
  }
  return;
}

Assistant:

void SetNoArena(const ::std::string* default_value, ::std::string&& value) {
    if (IsDefault(default_value)) {
      ptr_ = new ::std::string(std::move(value));
    } else {
      *ptr_ = std::move(value);
    }
  }